

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

void __thiscall CTextRender::SetFontLanguageVariant(CTextRender *this,char *pLanguageFile)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *pFamilyName;
  
  if (this->m_pGlyphMap == (CGlyphMap *)0x0) {
    return;
  }
  if (this->m_paVariants == (CFontLanguageVariant *)0x0) {
    pFamilyName = (char *)0x0;
  }
  else {
    lVar2 = 0x200;
    pFamilyName = (char *)0x0;
    for (lVar3 = 0; lVar3 < this->m_NumVariants; lVar3 = lVar3 + 1) {
      iVar1 = str_comp_filenames(pLanguageFile,(char *)((long)this->m_paVariants + lVar2 + -0x200));
      if (iVar1 == 0) {
        pFamilyName = this->m_paVariants->m_aLanguageFile + lVar2;
        this->m_CurrentVariant = (int)lVar3;
        break;
      }
      lVar2 = lVar2 + 0x280;
    }
  }
  CGlyphMap::SetVariantFaceByName(this->m_pGlyphMap,pFamilyName);
  return;
}

Assistant:

void CTextRender::SetFontLanguageVariant(const char *pLanguageFile)
{
	if(!m_pGlyphMap)
		return;	

	char *pFamilyName = NULL;

	if(m_paVariants)
	{
		for(int i = 0; i < m_NumVariants; ++i)
		{
			if(str_comp_filenames(pLanguageFile, m_paVariants[i].m_aLanguageFile) == 0)
			{
				pFamilyName = m_paVariants[i].m_aFamilyName;
				m_CurrentVariant = i;
				break;
			}
		}
	}

	m_pGlyphMap->SetVariantFaceByName(pFamilyName);
}